

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void speech_prog_elven_mirror(OBJ_DATA *obj,CHAR_DATA *ch,char *speech)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *ch_00;
  ROOM_INDEX_DATA *pRVar3;
  char *pcVar4;
  char *pcVar5;
  CHAR_DATA *ch_01;
  OBJ_DATA *in_RDI;
  int rand;
  ROOM_INDEX_DATA *room2;
  ROOM_INDEX_DATA *room;
  char *sect;
  CHAR_DATA *victim;
  char buf [4608];
  char arg4 [4608];
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  void *in_stack_ffffffffffffa5a8;
  ROOM_INDEX_DATA *room_00;
  char *in_stack_ffffffffffffa5b0;
  CHAR_DATA *in_stack_ffffffffffffa5b8;
  int npulse;
  undefined4 in_stack_ffffffffffffa5c0;
  undefined4 in_stack_ffffffffffffa5c4;
  char *in_stack_ffffffffffffa5d0;
  char *in_stack_ffffffffffffa5d8;
  char local_5a18 [24];
  CHAR_DATA *in_stack_ffffffffffffa600;
  char *in_stack_ffffffffffffb7c8;
  char local_4818;
  char *in_stack_ffffffffffffc9b0;
  CHAR_DATA *in_stack_ffffffffffffc9b8;
  
  bVar1 = is_worn(in_RDI);
  if (bVar1) {
    half_chop((char *)CONCAT44(in_stack_ffffffffffffa5c4,in_stack_ffffffffffffa5c0),
              (char *)in_stack_ffffffffffffa5b8,in_stack_ffffffffffffa5b0);
    half_chop((char *)CONCAT44(in_stack_ffffffffffffa5c4,in_stack_ffffffffffffa5c0),
              (char *)in_stack_ffffffffffffa5b8,in_stack_ffffffffffffa5b0);
    bVar1 = str_prefix(in_stack_ffffffffffffa5d8,in_stack_ffffffffffffa5d0);
    if (((!bVar1) && (local_4818 != '\0')) &&
       (ch_00 = get_char_world(in_stack_ffffffffffffc9b8,in_stack_ffffffffffffc9b0),
       ch_00 != (CHAR_DATA *)0x0)) {
      pRVar3 = ch_00->in_room;
      act((char *)CONCAT44(in_stack_ffffffffffffa5c4,in_stack_ffffffffffffa5c0),
          in_stack_ffffffffffffa5b8,in_stack_ffffffffffffa5b0,in_stack_ffffffffffffa5a8,0);
      ch_01 = (CHAR_DATA *)(ulong)((int)pRVar3->sector_type - 1);
      switch(ch_01) {
      case (CHAR_DATA *)0x0:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0x1:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0x2:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0x3:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0x4:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0x5:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0x6:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0x7:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0x8:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0x9:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0xa:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0xb:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0xc:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0xd:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0xe:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0xf:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0x10:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0x11:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0x12:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      case (CHAR_DATA *)0x13:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
        break;
      default:
        pRVar3 = (ROOM_INDEX_DATA *)talloc_string(in_stack_ffffffffffffb7c8);
      }
      iVar2 = number_percent();
      if (iVar2 == 1) {
        act((char *)CONCAT44(1,in_stack_ffffffffffffa5c0),ch_01,in_stack_ffffffffffffa5b0,
            in_stack_ffffffffffffa5a8,0);
        npulse = (int)((ulong)ch_01 >> 0x20);
        char_from_room(in_stack_ffffffffffffa600);
        char_to_room(ch_00,pRVar3);
        do_look((CHAR_DATA *)buf._456_8_,(char *)buf._448_8_);
        char_from_room(in_stack_ffffffffffffa600);
        char_to_room(ch_00,pRVar3);
        WAIT_STATE((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffa5c0),npulse);
        free_pstring(in_stack_ffffffffffffa5b0);
        room_00 = (ROOM_INDEX_DATA *)local_5a18;
        pcVar5 = ch_00->name;
        pcVar4 = get_room_name(room_00);
        sprintf((char *)room_00,
                "A curious mirror lies here, humming softly.  Peering into the glass, you see %s standing in %s."
                ,pcVar5,pcVar4);
        pcVar5 = palloc_string((char *)pRVar3);
        in_RDI->description = pcVar5;
      }
      else if ((iVar2 < 2) || (0x59 < iVar2)) {
        if (0x59 < iVar2) {
          act((char *)CONCAT44(iVar2,in_stack_ffffffffffffa5c0),ch_01,in_stack_ffffffffffffa5b0,
              in_stack_ffffffffffffa5a8,0);
        }
      }
      else {
        act((char *)CONCAT44(iVar2,in_stack_ffffffffffffa5c0),ch_01,in_stack_ffffffffffffa5b0,
            in_stack_ffffffffffffa5a8,0);
        sprintf(local_5a18,"Peering into the mirror, you see $N %s.",pRVar3);
        act((char *)CONCAT44(iVar2,in_stack_ffffffffffffa5c0),ch_01,in_stack_ffffffffffffa5b0,
            in_stack_ffffffffffffa5a8,0);
        free_pstring(in_stack_ffffffffffffa5b0);
        sprintf(local_5a18,
                "A curious mirror lies here, humming softly.  Peering into the glass, you see %s %s."
                ,ch_00->name,pRVar3);
        pcVar5 = palloc_string((char *)pRVar3);
        in_RDI->description = pcVar5;
      }
    }
  }
  return;
}

Assistant:

void speech_prog_elven_mirror(OBJ_DATA *obj, CHAR_DATA *ch, char *speech)
{
	char arg1[MSL], arg2[MSL], arg3[MSL], arg4[MSL], buf[MSL];
	CHAR_DATA *victim;
	char *sect;
	ROOM_INDEX_DATA *room, *room2 = ch->in_room;
	int rand;

	if (!is_worn(obj))
		return;

	half_chop(speech, arg1, arg2);
	half_chop(arg2, arg3, arg4);

	if (str_prefix(arg1, "show"))
		return;

	if (!arg4[0] || !(victim = get_char_world(ch, arg4)))
		return;

	room = victim->in_room;
	act("$p begins to change colour as it attempts to find $N.", ch, obj, victim, TO_ROOM);

	switch (room->sector_type)
	{
		case SECT_INSIDE:
			sect = talloc_string("inside a room");
			break;
		case SECT_CITY:
			sect = talloc_string("in a city");
			break;
		case SECT_FOREST:
			sect = talloc_string("in a forest");
			break;
		case SECT_MOUNTAIN:
			sect = talloc_string("in the mountains");
			break;
		case SECT_FIELD:
			sect = talloc_string("in a field");
			break;
		case SECT_HILLS:
			sect = talloc_string("among some hills");
			break;
		case SECT_WATER:
			sect = talloc_string("on a body of water");
			break;
		case SECT_UNDERWATER:
			sect = talloc_string("underwater");
			break;
		case SECT_AIR:
			sect = talloc_string("in mid-air");
			break;
		case SECT_CONFLAGRATION:
			sect = talloc_string("amidst a raging fire");
			break;
		case SECT_BURNING:
			sect = talloc_string("amidst a raging fire");
			break;
		case SECT_DESERT:
			sect = talloc_string("in a parched desert");
			break;
		case SECT_ROAD:
			sect = talloc_string("on a road");
			break;
		case SECT_TRAIL:
			sect = talloc_string("along a trail");
			break;
		case SECT_SWAMP:
			sect = talloc_string("in a swamp");
			break;
		case SECT_PARK:
			sect = talloc_string("in a park");
			break;
		case SECT_VERTICAL:
			sect = talloc_string("near some cliffs");
			break;
		case SECT_ICE:
			sect = talloc_string("amidst snow and ice");
			break;
		case SECT_SNOW:
			sect = talloc_string("amidst snow and ice");
			break;
		case SECT_CAVE:
			sect = talloc_string("in a cave");
			break;
		default:
			sect = talloc_string("but cannot make out their surroundings");
			break;
	}

	rand = number_percent();

	if (rand == 1)
	{
		act("$p suddenly stabilizes into a perfect image of $N!", ch, obj, victim, TO_CHAR);

		char_from_room(ch);
		char_to_room(ch, room);
		do_look(ch, "auto");
		char_from_room(ch);
		char_to_room(ch, room2);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);

		free_pstring(obj->description);
		sprintf(buf, "A curious mirror lies here, humming softly.  Peering into the glass, you see %s standing in %s.",
			victim->name,
			get_room_name(room));

		obj->description = palloc_string(buf);
		return;
	}

	if (rand > 1 && rand < 90)
	{
		act("$p forms into a hazy image of $N.", ch, obj, victim, TO_CHAR);
		sprintf(buf, "Peering into the mirror, you see $N %s.", sect);
		act(buf, ch, 0, victim, TO_CHAR);

		free_pstring(obj->description);
		sprintf(buf, "A curious mirror lies here, humming softly.  Peering into the glass, you see %s %s.", victim->name, sect);
		obj->description = palloc_string(buf);
		return;
	}

	if (rand > 89)
		act("$p fails to form into a coherent image.", ch, obj, 0, TO_CHAR);
}